

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::MenuItem(char *label,char *shortcut,bool selected,bool enabled)

{
  ImGuiWindow *size_arg;
  byte in_CL;
  byte selected_00;
  byte in_DL;
  char *in_RSI;
  ImVec4 *in_RDI;
  ImVec2 IVar1;
  float extra_w;
  float min_w;
  float shortcut_w;
  float w;
  bool pressed;
  ImGuiSelectableFlags flags;
  ImVec2 label_size;
  ImVec2 pos;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  float w2;
  undefined8 in_stack_ffffffffffffff28;
  ImGuiMenuColumns *in_stack_ffffffffffffff30;
  int count;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  float idx;
  ImVec2 *in_stack_ffffffffffffff48;
  ImGuiStyleVar in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff5f;
  char *in_stack_ffffffffffffff60;
  ImDrawList *in_stack_ffffffffffffff68;
  ImVec2 in_stack_ffffffffffffff70;
  ImVec2 local_88;
  ImVec2 local_80;
  float local_78;
  float local_74;
  ImVec2 local_70;
  float local_68;
  ImVec2 local_64;
  ImVec2 local_5c;
  float local_54;
  byte local_4d;
  uint local_4c;
  ImVec2 local_48;
  ImVec2 local_40;
  ImGuiStyle *local_38;
  ImGuiContext *local_30;
  ImGuiSelectableFlags in_stack_ffffffffffffffe0;
  bool local_1;
  
  w2 = (float)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  selected_00 = in_DL & 1;
  size_arg = GetCurrentWindow();
  if ((size_arg->SkipItems & 1U) == 0) {
    local_30 = GImGui;
    local_38 = &GImGui->Style;
    local_40 = (size_arg->DC).CursorPos;
    local_48 = CalcTextSize((char *)in_stack_ffffffffffffff48,
                            (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0),
                            (float)in_stack_ffffffffffffff38);
    local_4c = 8;
    if ((in_CL & 1) != 0) {
      local_4c = 0;
    }
    local_4c = local_4c | 0x2400000;
    if ((size_arg->DC).LayoutType == 0) {
      local_54 = local_48.x;
      (size_arg->DC).CursorPos.x =
           (float)(int)((local_38->ItemSpacing).x * 0.5) + (size_arg->DC).CursorPos.x;
      ImVec2::ImVec2(&local_5c,(local_38->ItemSpacing).x * 2.0,(local_38->ItemSpacing).y);
      count = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
      PushStyleVar(in_stack_ffffffffffffff54,in_stack_ffffffffffffff48);
      ImVec2::ImVec2(&local_64,local_54,0.0);
      local_4d = Selectable(in_RSI,(bool)selected_00,in_stack_ffffffffffffffe0,(ImVec2 *)size_arg);
      PopStyleVar(count);
      (size_arg->DC).CursorPos.x =
           (float)(int)((local_38->ItemSpacing).x * -0.5) + (size_arg->DC).CursorPos.x;
    }
    else {
      if (in_RSI == (char *)0x0) {
        idx = 0.0;
      }
      else {
        local_70 = CalcTextSize((char *)in_stack_ffffffffffffff48,
                                (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40
                                                ),SUB81((ulong)in_stack_ffffffffffffff38 >> 0x38,0),
                                (float)in_stack_ffffffffffffff38);
        idx = local_70.x;
      }
      local_68 = idx;
      local_74 = ImGuiMenuColumns::DeclColumns
                           (in_stack_ffffffffffffff30,
                            (float)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                            (float)in_stack_ffffffffffffff28,w2);
      local_80 = GetContentRegionAvail();
      local_78 = ImMax<float>(0.0,local_80.x - local_74);
      ImVec2::ImVec2(&local_88,local_74,0.0);
      local_4d = Selectable(in_RSI,(bool)selected_00,in_stack_ffffffffffffffe0,(ImVec2 *)size_arg);
      if (0.0 < local_68) {
        PushStyleColor((ImGuiCol)idx,in_RDI);
        in_stack_ffffffffffffff30 = (ImGuiMenuColumns *)&stack0xffffffffffffff68;
        ImVec2::ImVec2((ImVec2 *)in_stack_ffffffffffffff30,
                       (size_arg->DC).MenuColumns.Pos[1] + local_78,0.0);
        in_stack_ffffffffffffff70 = operator+(in_stack_ffffffffffffff18,(ImVec2 *)0x1a76fb);
        RenderText(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                   in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
        PopStyleColor((int)w2);
      }
      if ((selected_00 & 1) != 0) {
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff58,
                       local_30->FontSize * 0.4 + (size_arg->DC).MenuColumns.Pos[2] + local_78,
                       local_30->FontSize * 0.134 * 0.5);
        IVar1 = operator+(in_stack_ffffffffffffff18,(ImVec2 *)0x1a77b2);
        GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                    SUB84(in_stack_ffffffffffffff30,0));
        RenderCheckMark(in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,(ImU32)IVar1.y,IVar1.x);
      }
    }
    local_1 = (bool)(local_4d & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::MenuItem(const char* label, const char* shortcut, bool selected, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 pos = window->DC.CursorPos;
    ImVec2 label_size = CalcTextSize(label, NULL, true);

    // We've been using the equivalent of ImGuiSelectableFlags_SetNavIdOnHover on all Selectable() since early Nav system days (commit 43ee5d73),
    // but I am unsure whether this should be kept at all. For now moved it to be an opt-in feature used by menus only.
    ImGuiSelectableFlags flags = ImGuiSelectableFlags_SelectOnRelease | ImGuiSelectableFlags_SetNavIdOnHover | (enabled ? 0 : ImGuiSelectableFlags_Disabled);
    bool pressed;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Mimic the exact layout spacing of BeginMenu() to allow MenuItem() inside a menu bar, which is a little misleading but may be useful
        // Note that in this situation we render neither the shortcut neither the selected tick mark
        float w = label_size.x;
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(style.ItemSpacing.x * 2.0f, style.ItemSpacing.y));
        pressed = Selectable(label, false, flags, ImVec2(w, 0.0f));
        PopStyleVar();
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        // Menu item inside a vertical menu
        // (In a typical menu window where all items are BeginMenu() or MenuItem() calls, extra_w will always be 0.0f.
        //  Only when they are other items sticking out we're going to add spacing, yet only register minimum width into the layout system.
        float shortcut_w = shortcut ? CalcTextSize(shortcut, NULL).x : 0.0f;
        float min_w = window->DC.MenuColumns.DeclColumns(label_size.x, shortcut_w, IM_FLOOR(g.FontSize * 1.20f)); // Feedback for next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - min_w);
        pressed = Selectable(label, false, flags | ImGuiSelectableFlags_SpanAvailWidth, ImVec2(min_w, 0.0f));
        if (shortcut_w > 0.0f)
        {
            PushStyleColor(ImGuiCol_Text, g.Style.Colors[ImGuiCol_TextDisabled]);
            RenderText(pos + ImVec2(window->DC.MenuColumns.Pos[1] + extra_w, 0.0f), shortcut, NULL, false);
            PopStyleColor();
        }
        if (selected)
            RenderCheckMark(window->DrawList, pos + ImVec2(window->DC.MenuColumns.Pos[2] + extra_w + g.FontSize * 0.40f, g.FontSize * 0.134f * 0.5f), GetColorU32(enabled ? ImGuiCol_Text : ImGuiCol_TextDisabled), g.FontSize  * 0.866f);
    }

    IMGUI_TEST_ENGINE_ITEM_INFO(window->DC.LastItemId, label, window->DC.ItemFlags | ImGuiItemStatusFlags_Checkable | (selected ? ImGuiItemStatusFlags_Checked : 0));
    return pressed;
}